

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O2

Comparison __thiscall
Kernel::LiteralComparators::
Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>
::compare(Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>
          *this,Literal *l1,Literal *l2)

{
  Comparison CVar1;
  
  CVar1 = NegativeEquality::compare(&this->_c1,l1,l2);
  if (CVar1 != EQUAL) {
    return CVar1;
  }
  CVar1 = Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>
          ::compare(&this->_c2,l1,l2);
  return CVar1;
}

Assistant:

Comparison compare(Literal* l1, Literal* l2)
  {
    Comparison res1=_c1.compare(l1,l2);
    return (res1==EQUAL)?_c2.compare(l1,l2):res1;
  }